

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::InsertTypeTransitionAtBlock
          (BackwardPass *this,BasicBlock *block,int symId,AddPropertyCacheBucket *data,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  Var pvVar1;
  code *pcVar2;
  AddPropertyCacheBucket *pAVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  RegOpnd *pRVar7;
  BasicBlock *pBVar8;
  AddrOpnd *pAVar9;
  JITType *pJVar10;
  Var pvVar11;
  Func **ppFVar12;
  Func **ppFVar13;
  long lVar14;
  Instr *this_00;
  Instr **ppIVar15;
  long lVar16;
  Instr *pIVar17;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  Func **local_58;
  BVSparse<Memory::JitArenaAllocator> *local_50;
  BackwardPass *local_48;
  BasicBlock *local_40;
  AddPropertyCacheBucket *local_38;
  
  pBVar8 = block->next;
  local_58 = &block->func;
  ppFVar12 = (Func **)&pBVar8->firstInstr;
  if (pBVar8 == (BasicBlock *)0x0) {
    ppFVar12 = local_58;
  }
  lVar16 = 0xd0;
  if (pBVar8 != (BasicBlock *)0x0) {
    lVar16 = 0x18;
  }
  lVar16 = *(long *)((long)&(*ppFVar12)->m_alloc + lVar16);
  if (lVar16 == 0) {
    pIVar17 = (Instr *)0x0;
  }
  else {
    pIVar17 = *(Instr **)(lVar16 + 0x10);
  }
  ppIVar15 = &block->firstInstr;
  local_50 = upwardExposedUses;
  local_48 = this;
  local_40 = block;
  local_38 = data;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar6 = (Instr *)0x0;
  do {
    ppFVar12 = local_58;
    this_00 = *ppIVar15;
    if (this_00 == pIVar17) {
      pBVar8 = local_40->next;
      ppFVar13 = (Func **)&pBVar8->firstInstr;
      if (pBVar8 == (BasicBlock *)0x0) {
        ppFVar13 = local_58;
      }
      lVar16 = 0x18;
      lVar14 = lVar16;
      if (pBVar8 == (BasicBlock *)0x0) {
        lVar14 = 0xd0;
      }
      if (*(long *)(*(long *)((long)&(*ppFVar13)->m_alloc + lVar14) + 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x17a4,"(block->GetLastInstr()->m_next)","block->GetLastInstr()->m_next"
                          );
        if (!bVar4) {
LAB_003d3f58:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        pBVar8 = local_40->next;
      }
      ppFVar13 = (Func **)&pBVar8->firstInstr;
      if (pBVar8 == (BasicBlock *)0x0) {
        lVar16 = 0xd0;
        ppFVar13 = ppFVar12;
      }
      this_00 = *(Instr **)(*(long *)((long)&(*ppFVar13)->m_alloc + lVar16) + 0x10);
LAB_003d3e96:
      InsertTypeTransition(local_48,this_00,symId,local_38,local_50);
      return;
    }
    if ((pIVar6 != (Instr *)0x0) && (pIVar6->m_next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1787,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar4) goto LAB_003d3f58;
      *puVar5 = 0;
    }
    bVar4 = IR::Instr::IsRealInstr(this_00);
    if (bVar4) {
      if (this_00->m_opcode != AdjustObjType) goto LAB_003d3e96;
      pRVar7 = IR::Opnd::AsRegOpnd(this_00->m_src1);
      if ((pRVar7->m_sym->super_Sym).m_id == symId) {
        pAVar9 = IR::Opnd::AsAddrOpnd(this_00->m_dst);
        pAVar3 = local_38;
        pvVar1 = pAVar9->m_address;
        local_68.t = (local_38->finalType).t;
        pJVar10 = JITTypeHolderBase<void>::operator->(&local_68);
        pvVar11 = (Var)JITType::GetAddr(pJVar10);
        if (pvVar11 == pvVar1) {
          pAVar9 = IR::Opnd::AsAddrOpnd(this_00->m_src2);
          pvVar1 = pAVar9->m_address;
          local_60.t = (pAVar3->initialType).t;
          pJVar10 = JITTypeHolderBase<void>::operator->(&local_60);
          pvVar11 = (Var)JITType::GetAddr(pJVar10);
          if (pvVar11 == pvVar1) {
            return;
          }
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1794,
                           "((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr())"
                           ,
                           "(intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr()"
                          );
        if (bVar4) {
          *puVar5 = 0;
          return;
        }
        goto LAB_003d3f58;
      }
    }
    ppIVar15 = &this_00->m_next;
    pIVar6 = this_00;
  } while( true );
}

Assistant:

void
BackwardPass::InsertTypeTransitionAtBlock(BasicBlock *block, int symId, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    bool inserted = false;
    FOREACH_INSTR_IN_BLOCK(instr, block)
    {
        if (instr->IsRealInstr())
        {
            // Check for pre-existing type transition. There may be more than one AdjustObjType here,
            // so look at them all.
            if (instr->m_opcode == Js::OpCode::AdjustObjType)
            {
                if (instr->GetSrc1()->AsRegOpnd()->m_sym->m_id == (SymID)symId)
                {
                    // This symbol already has a type transition at this point.
                    // It *must* be doing the same transition we're already trying to do.
                    Assert((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() &&
                           (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr());
                    // Nothing to do.
                    return;
                }
            }
            else
            {
                this->InsertTypeTransition(instr, symId, data, upwardExposedUses);
                inserted = true;
                break;
            }
        }
    }
    NEXT_INSTR_IN_BLOCK;
    if (!inserted)
    {
        Assert(block->GetLastInstr()->m_next);
        this->InsertTypeTransition(block->GetLastInstr()->m_next, symId, data, upwardExposedUses);
    }
}